

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *text;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  text = 
  "target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(\n  $number$, this->$name$_, target);\n"
  ;
  if (bVar1) {
    text = 
    "if (this->$name$_size() > 0) {\n  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n    $number$,\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n    target);\n  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(    _$name$_cached_byte_size_, target);\n  target = ::google::protobuf::internal::WireFormatLite::WriteEnumNoTagToArray(\n    this->$name$_, target);\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  if (descriptor_->is_packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n"
      "    $number$,\n"
      "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n"
      "    target);\n"
      "  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray("
      "    _$name$_cached_byte_size_, target);\n"
      "  target = ::google::protobuf::internal::WireFormatLite::WriteEnumNoTagToArray(\n"
      "    this->$name$_, target);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(\n"
      "  $number$, this->$name$_, target);\n");
  }
}